

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

string * __thiscall
perfetto::protos::gen::NotifyDataSourceStoppedRequest::SerializeAsString_abi_cxx11_
          (string *__return_storage_ptr__,NotifyDataSourceStoppedRequest *this)

{
  Message *msg_00;
  undefined1 local_d8 [8];
  HeapBuffered<protozero::Message> msg;
  NotifyDataSourceStoppedRequest *this_local;
  
  msg.msg_.root_arena_.blocks_.
  super__List_base<protozero::MessageArena::Block,_std::allocator<protozero::MessageArena::Block>_>.
  _M_impl._M_node._M_size = (size_t)this;
  protozero::HeapBuffered<protozero::Message>::HeapBuffered
            ((HeapBuffered<protozero::Message> *)local_d8);
  msg_00 = protozero::HeapBuffered<protozero::Message>::get
                     ((HeapBuffered<protozero::Message> *)local_d8);
  Serialize(this,msg_00);
  protozero::HeapBuffered<protozero::Message>::SerializeAsString_abi_cxx11_
            (__return_storage_ptr__,(HeapBuffered<protozero::Message> *)local_d8);
  protozero::HeapBuffered<protozero::Message>::~HeapBuffered
            ((HeapBuffered<protozero::Message> *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

std::string NotifyDataSourceStoppedRequest::SerializeAsString() const {
  ::protozero::HeapBuffered<::protozero::Message> msg;
  Serialize(msg.get());
  return msg.SerializeAsString();
}